

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trainer.cc
# Opt level: O0

void __thiscall
xLearn::Trainer::show_train_info
          (Trainer *this,real_t tr_loss,real_t te_loss,real_t te_metric,real_t time_cost,
          bool validate,index_t epoch)

{
  ostream *poVar1;
  ostream *poVar2;
  uint in_EDX;
  byte in_SIL;
  long in_RDI;
  float in_XMM0_Da;
  undefined1 auVar3 [16];
  undefined1 auVar4 [64];
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  Modifier reset;
  Modifier green;
  vector<int,_std::allocator<int>_> width_list;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  str_list;
  value_type *in_stack_fffffffffffffe98;
  ostream *in_stack_fffffffffffffea0;
  Modifier local_124;
  Modifier local_120;
  undefined4 local_11c;
  string local_118 [36];
  undefined4 local_f4;
  string local_f0 [36];
  undefined4 local_cc;
  string local_c8 [36];
  undefined4 local_a4;
  string local_a0 [32];
  undefined4 local_80;
  string local_70 [8];
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffa0;
  undefined1 extraout_var [56];
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x224470);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x22447d);
  StringPrintf_abi_cxx11_((char *)local_70,"%d",(ulong)in_EDX);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  std::__cxx11::string::~string(local_70);
  local_80 = 6;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffea0,
             (value_type_conflict1 *)in_stack_fffffffffffffe98);
  StringPrintf_abi_cxx11_((char *)(double)in_XMM0_Da,local_a0,"%.6f");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  std::__cxx11::string::~string(local_a0);
  local_a4 = 0x14;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffea0,
             (value_type_conflict1 *)in_stack_fffffffffffffe98);
  if ((in_SIL & 1) != 0) {
    StringPrintf_abi_cxx11_((char *)(double)in_XMM1_Da,local_c8,"%.6f");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    std::__cxx11::string::~string(local_c8);
    local_cc = 0x14;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffea0,
               (value_type_conflict1 *)in_stack_fffffffffffffe98);
    if (*(long *)(in_RDI + 0x38) != 0) {
      StringPrintf_abi_cxx11_((char *)(double)in_XMM2_Da,local_f0,"%.6f");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      std::__cxx11::string::~string(local_f0);
      local_f4 = 0x14;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffea0,
                 (value_type_conflict1 *)in_stack_fffffffffffffe98);
    }
  }
  StringPrintf_abi_cxx11_((char *)(double)in_XMM3_Da,local_118,"%.2f");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  auVar4._0_8_ = std::__cxx11::string::~string(local_118);
  auVar4._8_56_ = extraout_var;
  auVar3 = auVar4._0_16_;
  local_11c = 0x14;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffea0,
             (value_type_conflict1 *)in_stack_fffffffffffffe98);
  Color::Modifier::Modifier(&local_120,FG_GREEN);
  Color::Modifier::Modifier(&local_124,RESET);
  poVar1 = Color::operator<<(in_stack_fffffffffffffea0,(Modifier *)in_stack_fffffffffffffe98);
  std::operator<<(poVar1,"[ ");
  Color::operator<<(in_stack_fffffffffffffea0,(Modifier *)in_stack_fffffffffffffe98);
  std::ios_base::width((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),4);
  auVar3 = vcvtusi2sd_avx512f(auVar3,in_EDX);
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (&std::cout,(int)((auVar3._0_8_ / (double)*(int *)(in_RDI + 0x18)) * 100.0));
  poVar1 = std::operator<<(poVar1,"%");
  poVar2 = Color::operator<<(in_stack_fffffffffffffea0,(Modifier *)in_stack_fffffffffffffe98);
  poVar2 = std::operator<<(poVar2,"      ]");
  Color::operator<<(poVar2,(Modifier *)in_stack_fffffffffffffe98);
  Color::print_row<std::__cxx11::string>(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)poVar1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)poVar1);
  return;
}

Assistant:

void Trainer::show_train_info(real_t tr_loss, 
                              real_t te_loss,
                              real_t te_metric,
                              real_t time_cost, 
                              bool validate,
                              index_t epoch) {
  std::vector<std::string> str_list;
  std::vector<int> width_list;
  str_list.push_back(StringPrintf("%d", epoch));
  width_list.push_back(6);
  str_list.push_back(StringPrintf("%.6f", tr_loss));
  width_list.push_back(20);
  if (validate) {
    str_list.push_back(StringPrintf("%.6f", te_loss));
    width_list.push_back(20);
    if (metric_ != nullptr) {
      str_list.push_back(StringPrintf("%.6f", te_metric));
      width_list.push_back(20);
    }
  }
  str_list.push_back(StringPrintf("%.2f", time_cost));
  width_list.push_back(20);
  Color::Modifier green(Color::FG_GREEN);
  Color::Modifier reset(Color::RESET);
  std::cout << green << "[ " << reset;
  std::cout.width(4); 
  std::cout << static_cast<int>(epoch*1.0/epoch_*100) 
            << "%" << green << "      ]"  << reset;
  Color::print_row(str_list, width_list);
}